

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive_tester.cc
# Opt level: O3

void re2::EgrepTest(int maxatoms,int maxops,string *alphabet,int maxstrlen,string *stralphabet,
                   string *wrapper)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ops;
  long lVar1;
  allocator local_e5;
  int local_e4;
  int local_e0;
  int local_dc;
  string *local_d8;
  string *local_d0;
  string *local_c8;
  StringPiece local_c0;
  char *local_b0;
  undefined4 local_a8;
  StringPiece local_a0;
  char *local_90;
  undefined4 local_88;
  string local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  lVar1 = 0;
  local_e4 = maxatoms;
  local_e0 = maxops;
  local_dc = maxstrlen;
  local_d8 = wrapper;
  local_d0 = stralphabet;
  local_c8 = alphabet;
  do {
    local_90 = "";
    local_88 = 0;
    local_a0.ptr_ = (local_c8->_M_dataplus)._M_p;
    local_a0.length_ = (int)local_c8->_M_string_length;
    Split_abi_cxx11_(&local_48,(re2 *)&local_90,&local_a0,(StringPiece *)local_c8);
    ops = RegexpGenerator::EgrepOps_abi_cxx11_();
    local_b0 = "";
    local_a8 = 0;
    local_c0.ptr_ = (local_d0->_M_dataplus)._M_p;
    local_c0.length_ = (int)local_d0->_M_string_length;
    Split_abi_cxx11_(&local_60,(re2 *)&local_b0,&local_c0,(StringPiece *)local_d0);
    std::__cxx11::string::string
              ((string *)&local_80,
               (char *)((long)&DAT_0013d184 + (long)*(int *)((long)&DAT_0013d184 + lVar1)),&local_e5
              );
    ExhaustiveTest(local_e4,local_e0,&local_48,ops,local_dc,&local_60,local_d8,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x10);
  return;
}

Assistant:

void EgrepTest(int maxatoms, int maxops, const string& alphabet,
               int maxstrlen, const string& stralphabet,
               const string& wrapper) {
  const char* tops[] = { "", "^(?:%s)", "(?:%s)$", "^(?:%s)$" };

  for (int i = 0; i < arraysize(tops); i++) {
    ExhaustiveTest(maxatoms, maxops,
                   Split("", alphabet),
                   RegexpGenerator::EgrepOps(),
                   maxstrlen,
                   Split("", stralphabet),
                   wrapper,
                   tops[i]);
  }
}